

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O1

void __thiscall BasePort::BasePort(BasePort *this,int portNum,ostream *ostr)

{
  long lVar1;
  unsigned_long unaff_retaddr;
  
  this->_vptr_BasePort = (_func_int **)&PTR___cxa_pure_virtual_00123638;
  this->outStr = ostr;
  this->ReadErrorCounter_ = 0;
  this->Protocol_ = PROTOCOL_SEQ_RW;
  this->IsAllBoardsBroadcastCapable_ = false;
  this->IsAllBoardsRev4_5_ = false;
  this->IsAllBoardsRev4_6_ = false;
  this->IsAllBoardsRev6_ = false;
  this->IsAllBoardsRev7_ = false;
  this->IsAllBoardsRev8_9_ = false;
  this->PortNum = portNum;
  this->FwBusGeneration = 0;
  this->newFwBusGeneration = 0;
  this->autoReScan = true;
  this->NumOfNodes_ = 0;
  this->NumOfBoards_ = 0;
  this->BoardInUseMask_ = 0;
  this->max_board = 0;
  this->HubBoard = '\x10';
  (this->bcReadInfo).gapTime = 0.0;
  (this->bcReadInfo).readSizeQuads = 0;
  (this->bcReadInfo).readSequence = 0;
  (this->bcReadInfo).updateStartTime = 0.0;
  *(undefined8 *)((long)&(this->bcReadInfo).updateStartTime + 1) = 0;
  *(undefined8 *)((long)&(this->bcReadInfo).updateFinishTime + 1) = 0;
  (this->bcReadInfo).readStartTime = 0.0;
  (this->bcReadInfo).readFinishTime = 0.0;
  (this->bcReadInfo).readOverflow = false;
  lVar1 = 0;
  do {
    *(undefined2 *)(&(this->bcReadInfo).boardInfo[0].inUse + lVar1) = 0;
    *(undefined8 *)((long)&(this->bcReadInfo).boardInfo[0].updateTime + lVar1) = 0;
    *(undefined8 *)((long)&(this->bcReadInfo).boardInfo[0].blockNum + lVar1) = 0;
    *(undefined8 *)((long)&(this->bcReadInfo).boardInfo[0].blockSize + lVar1 + 1) = 0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x200);
  (this->bcReadInfo).gapTimeMin = 1.0;
  (this->bcReadInfo).gapTimeMax = 0.0;
  this->BoardList[0] = (BoardIO *)0x0;
  this->BoardList[1] = (BoardIO *)0x0;
  this->BoardList[2] = (BoardIO *)0x0;
  this->BoardList[3] = (BoardIO *)0x0;
  this->BoardList[4] = (BoardIO *)0x0;
  this->BoardList[5] = (BoardIO *)0x0;
  this->BoardList[6] = (BoardIO *)0x0;
  this->BoardList[7] = (BoardIO *)0x0;
  this->BoardList[8] = (BoardIO *)0x0;
  this->BoardList[9] = (BoardIO *)0x0;
  this->BoardList[10] = (BoardIO *)0x0;
  this->BoardList[0xb] = (BoardIO *)0x0;
  this->BoardList[0xc] = (BoardIO *)0x0;
  this->BoardList[0xd] = (BoardIO *)0x0;
  this->BoardList[0xe] = (BoardIO *)0x0;
  this->BoardList[0xf] = (BoardIO *)0x0;
  lVar1 = 0;
  memset(this->FirmwareVersion,0,0x140);
  do {
    this->Board2Node[lVar1] = 0x40;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  this->WriteBufferBroadcast = (uchar *)0x0;
  this->ReadBufferBroadcast = (uchar *)0x0;
  this->GenericBuffer = (uchar *)0x0;
  builtin_memcpy(this->Node2Board,
                 "\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10"
                 ,0x40);
  AddHardwareVersion(0x10d27f);
  AddHardwareVersion(0x10d289);
  AddHardwareVersion(0x10d293);
  AddHardwareVersion(0x10d29d);
  AddHardwareVersion(unaff_retaddr);
  return;
}

Assistant:

BasePort::BasePort(int portNum, std::ostream &ostr):
        outStr(ostr),
        Protocol_(BasePort::PROTOCOL_SEQ_RW),
        IsAllBoardsBroadcastCapable_(false),
        IsAllBoardsRev4_5_(false),
        IsAllBoardsRev4_6_(false),
        IsAllBoardsRev6_(false),
        IsAllBoardsRev7_(false),
        IsAllBoardsRev8_9_(false),
        ReadErrorCounter_(0),
        PortNum(portNum),
        FwBusGeneration(0),
        newFwBusGeneration(0),
        autoReScan(true),
        NumOfNodes_(0),
        NumOfBoards_(0),
        BoardInUseMask_(0),
        max_board(0),
        HubBoard(BoardIO::MAX_BOARDS)
{
    size_t i;
    for (i = 0; i < BoardIO::MAX_BOARDS; i++) {
        BoardList[i] = 0;
        FirmwareVersion[i] = 0;
        FpgaVersion[i] = 0;
        HardwareVersion[i] = 0;
        Board2Node[i] = MAX_NODES;
    }
    ReadBufferBroadcast = 0;
    WriteBufferBroadcast = 0;
    GenericBuffer = 0;
    for (i = 0; i < MAX_NODES; i++)
        Node2Board[i] = BoardIO::MAX_BOARDS;
    // Note that AddHardwareVersion will not add duplicates
    BasePort::AddHardwareVersion(QLA1_String);
    BasePort::AddHardwareVersion(dRA1_String);
    BasePort::AddHardwareVersion(DQLA_String);
    BasePort::AddHardwareVersion(BCFG_String);
    BasePort::AddHardwareVersion(0x54455354); // "TEST"
}